

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextInput::matchAtomArg(AspifTextInput *this)

{
  char cVar1;
  BufferedStream *this_00;
  BufferedStream *in_RDI;
  AspifTextInput *unaff_retaddr;
  int p;
  char c;
  int iVar2;
  undefined4 in_stack_fffffffffffffff4;
  BufferedStream *this_01;
  
  iVar2 = 0;
  this_01 = in_RDI;
  while( true ) {
    while( true ) {
      this_00 = ProgramReader::stream((ProgramReader *)in_RDI);
      cVar1 = BufferedStream::peek(this_00);
      in_stack_fffffffffffffff4 = CONCAT13(cVar1,(int3)in_stack_fffffffffffffff4);
      if (cVar1 == '\0') {
        return;
      }
      if (cVar1 != '\"') break;
      matchStr(unaff_retaddr);
    }
    if ((cVar1 == ')') && (iVar2 = iVar2 + -1, iVar2 < 0)) break;
    if ((cVar1 == ',') && (iVar2 == 0)) {
      return;
    }
    iVar2 = (uint)(cVar1 == '(') + iVar2;
    ProgramReader::stream((ProgramReader *)in_RDI);
    BufferedStream::get(this_01);
    push((AspifTextInput *)CONCAT44(in_stack_fffffffffffffff4,iVar2),(char)((ulong)in_RDI >> 0x38));
    skipws((AspifTextInput *)0x10f6ff);
  }
  return;
}

Assistant:

void AspifTextInput::matchAtomArg() {
	char c;
	for (int p = 0; (c = stream()->peek()) != 0; ) {
		if (c == '"') {
			matchStr();
		}
		else {
			if      (c == ')' && --p < 0) { break; }
			else if (c == ',' &&  p == 0) { break; }
			p += int(c == '(');
			push(stream()->get());
			skipws();
		}
	}
}